

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O0

size_t __thiscall sentencepiece::SelfTestData::ByteSizeLong(SelfTestData *this)

{
  bool bVar1;
  int iVar2;
  reference value;
  size_t sVar3;
  InternalMetadata *this_00;
  long lVar4;
  int cached_size;
  SelfTestData_Sample *msg;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<sentencepiece::SelfTestData_Sample> *__range1;
  size_t sStack_50;
  uint32 cached_has_bits;
  size_t total_size;
  SelfTestData *this_local;
  
  sStack_50 = google::protobuf::internal::ExtensionSet::ByteSize(&this->_extensions_);
  iVar2 = _internal_samples_size(this);
  sStack_50 = (long)iVar2 + sStack_50;
  __end1 = google::protobuf::RepeatedPtrField<sentencepiece::SelfTestData_Sample>::begin
                     (&this->samples_);
  msg = (SelfTestData_Sample *)
        google::protobuf::RepeatedPtrField<sentencepiece::SelfTestData_Sample>::end(&this->samples_)
  ;
  while( true ) {
    bVar1 = google::protobuf::internal::
            RepeatedPtrIterator<const_sentencepiece::SelfTestData_Sample>::operator!=
                      (&__end1,(iterator *)&msg);
    if (!bVar1) break;
    value = google::protobuf::internal::
            RepeatedPtrIterator<const_sentencepiece::SelfTestData_Sample>::operator*(&__end1);
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSize<sentencepiece::SelfTestData_Sample>(value);
    sStack_50 = sVar3 + sStack_50;
    google::protobuf::internal::RepeatedPtrIterator<const_sentencepiece::SelfTestData_Sample>::
    operator++(&__end1);
  }
  if (((uint)(this->super_MessageLite)._internal_metadata_.ptr_ & 1) == 1) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    if (((uint)this_00->ptr_ & 1) == 1) {
      google::protobuf::internal::InternalMetadata::
      PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                (this_00);
    }
    else {
      google::protobuf::internal::GetEmptyString_abi_cxx11_();
    }
    lVar4 = std::__cxx11::string::size();
    sStack_50 = lVar4 + sStack_50;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_50);
  SetCachedSize(this,iVar2);
  return sStack_50;
}

Assistant:

size_t SelfTestData::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:sentencepiece.SelfTestData)
  size_t total_size = 0;

  total_size += _extensions_.ByteSize();

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .sentencepiece.SelfTestData.Sample samples = 1;
  total_size += 1UL * this->_internal_samples_size();
  for (const auto& msg : this->samples_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}